

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O0

Gia_Man_t * Gia_ManFlipUnfold(Gia_Man_t *p,Vec_Int_t *vMap)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Gia_Man_t *p_00;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Gia_Man_t *p_01;
  bool bVar7;
  int local_38;
  int local_34;
  int iFuncVars;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Vec_Int_t *vMap_local;
  Gia_Man_t *p_local;
  
  local_38 = 0;
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1 << 2);
  pcVar5 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar5;
  Gia_ManHashAlloc(p_00);
  pGVar6 = Gia_ManConst0(p);
  pGVar6->Value = 0;
  local_34 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar7 = false;
    if (local_34 < iVar1) {
      _iFuncVars = Gia_ManCi(p,local_34);
      bVar7 = _iFuncVars != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    uVar2 = Gia_ManAppendCi(p_00);
    _iFuncVars->Value = uVar2;
    local_34 = local_34 + 1;
  }
  local_34 = 0;
  while( true ) {
    bVar7 = false;
    if (local_34 < p->nObjs) {
      _iFuncVars = Gia_ManObj(p,local_34);
      bVar7 = _iFuncVars != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjIsAnd(_iFuncVars);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFanin0Copy(_iFuncVars);
      iVar3 = Gia_ObjFanin1Copy(_iFuncVars);
      uVar2 = Gia_ManHashAnd(p_00,iVar1,iVar3);
      _iFuncVars->Value = uVar2;
      iVar1 = Vec_IntEntry(vMap,local_38);
      if (iVar1 == 0) {
        Gia_ManAppendCi(p_00);
        local_38 = local_38 + 1;
      }
      else {
        iVar1 = Gia_ManAppendCi(p_00);
        uVar2 = Gia_ManHashXor(p_00,iVar1,_iFuncVars->Value);
        _iFuncVars->Value = uVar2;
        local_38 = local_38 + 1;
      }
    }
    local_34 = local_34 + 1;
  }
  iVar1 = Vec_IntSize(vMap);
  if (local_38 != iVar1) {
    __assert_fail("iFuncVars == Vec_IntSize(vMap)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x200,"Gia_Man_t *Gia_ManFlipUnfold(Gia_Man_t *, Vec_Int_t *)");
  }
  local_34 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar7 = false;
    if (local_34 < iVar1) {
      _iFuncVars = Gia_ManCo(p,local_34);
      bVar7 = _iFuncVars != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjFanin0Copy(_iFuncVars);
    uVar2 = Gia_ManAppendCo(p_00,iVar1);
    _iFuncVars->Value = uVar2;
    local_34 = local_34 + 1;
  }
  p_01 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  iVar1 = Gia_ManPiNum(p_01);
  iVar3 = Gia_ManCiNum(p);
  iVar4 = Gia_ManAndNum(p);
  if (iVar1 != iVar3 + iVar4) {
    __assert_fail("Gia_ManPiNum(pNew) == Gia_ManCiNum(p) + Gia_ManAndNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x205,"Gia_Man_t *Gia_ManFlipUnfold(Gia_Man_t *, Vec_Int_t *)");
  }
  return p_01;
}

Assistant:

Gia_Man_t * Gia_ManFlipUnfold( Gia_Man_t * p, Vec_Int_t * vMap )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iFuncVars = 0;
    pNew = Gia_ManStart( 4 * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
    {
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        if ( Vec_IntEntry(vMap, iFuncVars++) )
            pObj->Value = Gia_ManHashXor( pNew, Gia_ManAppendCi(pNew), pObj->Value );
        else
            Gia_ManAppendCi(pNew);
    }
    assert( iFuncVars == Vec_IntSize(vMap) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == Gia_ManCiNum(p) + Gia_ManAndNum(p) );
    return pNew;
}